

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::ElementsTable::GetRGB(ElementsTable *this,int atomicnum)

{
  size_type sVar1;
  reference ppEVar2;
  int in_EDX;
  byte *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  value_type_conflict *__x;
  vector<double,_std::allocator<double>_> *colors;
  ElementsTable *in_stack_00008060;
  value_type_conflict *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  int iVar3;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  
  if ((*in_RSI & 1) == 0) {
    Init(in_stack_00008060);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3ceef9);
  std::vector<double,_std::allocator<double>_>::reserve(in_stack_ffffffffffffffa0,(size_type)in_RSI)
  ;
  if ((in_EDX < 0) ||
     (iVar3 = in_EDX,
     sVar1 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::size
                       ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                        (in_RSI + 0x88)), (int)sVar1 <= iVar3)) {
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    ppEVar2 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::operator[]
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RSI + 0x88),(long)in_EDX);
    Element::GetRed(*ppEVar2);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    ppEVar2 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::operator[]
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RSI + 0x88),(long)in_EDX);
    this_00 = (vector<double,_std::allocator<double>_> *)Element::GetGreen(*ppEVar2);
    std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffff68);
    ppEVar2 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::operator[]
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RSI + 0x88),(long)in_EDX);
    __x = (value_type_conflict *)Element::GetBlue(*ppEVar2);
    std::vector<double,_std::allocator<double>_>::push_back(this_00,__x);
  }
  return in_RDI;
}

Assistant:

std::vector<RealType> ElementsTable::GetRGB(int atomicnum) {
    if (!init_) Init();

    std::vector<RealType> colors;
    colors.reserve(3);

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size())) {
      colors.push_back(0.0);
      colors.push_back(0.0);
      colors.push_back(0.0);
      return (colors);
    }

    colors.push_back(elements_[atomicnum]->GetRed());
    colors.push_back(elements_[atomicnum]->GetGreen());
    colors.push_back(elements_[atomicnum]->GetBlue());

    return (colors);
  }